

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O3

int mg_session_read_relationship(mg_session *session,mg_relationship **rel)

{
  int iVar1;
  mg_relationship *val;
  
  iVar1 = mg_session_check_struct_header(session,0xb5,'R');
  if (iVar1 == 0) {
    val = (mg_relationship *)mg_allocator_malloc(session->decoder_allocator,0x28);
    if (val == (mg_relationship *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(session,(int64_t *)val);
      if (((iVar1 == 0) && (iVar1 = mg_session_read_integer(session,&val->start_id), iVar1 == 0)) &&
         (iVar1 = mg_session_read_integer(session,&val->end_id), iVar1 == 0)) {
        iVar1 = mg_session_read_string(session,&val->type);
        if (iVar1 == 0) {
          iVar1 = mg_session_read_map(session,&val->properties);
          if (iVar1 == 0) {
            *rel = val;
            return 0;
          }
          mg_string_destroy_ca(val->type,session->decoder_allocator);
        }
      }
      mg_allocator_free(session->decoder_allocator,val);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_relationship(mg_session *session, mg_relationship **rel) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 5),
      MG_SIGNATURE_RELATIONSHIP));

  mg_relationship *trel =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_relationship));
  if (!trel) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  status = mg_session_read_integer(session, &trel->id);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &trel->start_id);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &trel->end_id);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_string(session, &trel->type);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_map(session, &trel->properties);
  if (status != 0) {
    goto cleanup_type;
  }

  *rel = trel;
  return 0;

cleanup_type:
  mg_string_destroy_ca(trel->type, session->decoder_allocator);

cleanup:
  mg_allocator_free(session->decoder_allocator, trel);
  return status;
}